

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::SimInfo(SimInfo *this,ForceField *ff,Globals *simParams)

{
  MoleculeStamp *this_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  reference ppCVar4;
  size_t sVar5;
  size_type sVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint_fast32_t seed;
  int j_1;
  int nRigidBodiesInStamp;
  int nAtomsInRigidBodies;
  int j;
  int nCutoffGroupsInStamp;
  int nAtomsInGroups;
  iterator i;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  int nRigidAtoms;
  RigidBodyStamp *rbStamp;
  CutoffGroupStamp *cgStamp;
  int nGroups;
  int nCutoffAtoms;
  int nMolWithSameStamp;
  MoleculeStamp *molStamp;
  Globals *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  RigidBodyStamp *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  MoleculeStamp *in_stack_fffffffffffffe38;
  SimInfo *in_stack_fffffffffffffe40;
  LocalIndexManager *in_stack_fffffffffffffe50;
  int local_98;
  int local_90;
  int local_8c;
  int local_84;
  __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
  local_78 [4];
  int local_54;
  RigidBodyStamp *local_50;
  MoleculeStamp *local_48;
  int local_3c;
  int local_38;
  int local_34;
  MoleculeStamp *local_30;
  
  *in_RDI = &PTR__SimInfo_004fbfd0;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  std::shared_ptr<OpenMD::Utils::RandNumGen>::shared_ptr
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)
             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
            );
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0xf) = 0;
  *(undefined1 *)((long)in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  std::
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  ::map((map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
         *)0x15ebbb);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15ebd7);
  std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::vector
            ((vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_> *)0x15ebf3);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15ec0f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15ec2b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15ec47);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15ec63);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x15ec7f);
  PairList::PairList((PairList *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  PairList::PairList((PairList *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  PairList::PairList((PairList *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  PairList::PairList((PairList *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  PropertyMap::PropertyMap((PropertyMap *)0x15ed13);
  in_RDI[0x5f] = 0;
  LocalIndexManager::LocalIndexManager(in_stack_fffffffffffffe50);
  std::__cxx11::string::string((string *)(in_RDI + 0x7e));
  std::__cxx11::string::string((string *)(in_RDI + 0x82));
  std::__cxx11::string::string((string *)(in_RDI + 0x86));
  std::__cxx11::string::string((string *)(in_RDI + 0x8a));
  std::__cxx11::string::string((string *)(in_RDI + 0x8e));
  std::__cxx11::string::string((string *)(in_RDI + 0x92));
  *(undefined1 *)(in_RDI + 0x96) = 0;
  *(undefined1 *)((long)in_RDI + 0x4b1) = 0;
  *(undefined1 *)((long)in_RDI + 0x4b2) = 0;
  *(undefined1 *)((long)in_RDI + 0x4b3) = 1;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x15ee1e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15ee3a);
  local_38 = 0;
  local_3c = 0;
  local_54 = 0;
  Globals::getComponents(in_stack_fffffffffffffe08);
  local_78[0]._M_current =
       (Component **)
       std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::begin
                 ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
                  in_stack_fffffffffffffe08);
  while( true ) {
    std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::end
              ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
               in_stack_fffffffffffffe08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       (__normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar1) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
              ::operator*(local_78);
    local_30 = Component::getMoleculeStamp(*ppCVar4);
    __gnu_cxx::
    __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
    ::operator*(local_78);
    bVar1 = Component::haveRegion((Component *)0x15eefe);
    this_00 = local_30;
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
      ::operator*(local_78);
      iVar3 = Component::getRegion((Component *)0x15ef33);
      MoleculeStamp::setRegion(this_00,iVar3);
    }
    else {
      MoleculeStamp::setRegion(local_30,-1);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
    ::operator*(local_78);
    local_34 = Component::getNMol((Component *)0x15f04e);
    addMoleculeStamp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    sVar5 = MoleculeStamp::getNAtoms((MoleculeStamp *)0x15f08a);
    *(int *)((long)in_RDI + 0x54) = *(int *)((long)in_RDI + 0x54) + (int)sVar5 * local_34;
    sVar5 = MoleculeStamp::getNBonds((MoleculeStamp *)0x15f0bd);
    *(int *)(in_RDI + 0xd) = *(int *)(in_RDI + 0xd) + (int)sVar5 * local_34;
    sVar5 = MoleculeStamp::getNBends((MoleculeStamp *)0x15f0f0);
    *(int *)((long)in_RDI + 0x6c) = *(int *)((long)in_RDI + 0x6c) + (int)sVar5 * local_34;
    sVar5 = MoleculeStamp::getNTorsions((MoleculeStamp *)0x15f123);
    *(int *)(in_RDI + 0xe) = *(int *)(in_RDI + 0xe) + (int)sVar5 * local_34;
    sVar5 = MoleculeStamp::getNInversions((MoleculeStamp *)0x15f156);
    *(int *)((long)in_RDI + 0x74) = *(int *)((long)in_RDI + 0x74) + (int)sVar5 * local_34;
    local_84 = 0;
    in_stack_fffffffffffffe40 =
         (SimInfo *)MoleculeStamp::getNCutoffGroups((MoleculeStamp *)0x15f194);
    iVar3 = (int)in_stack_fffffffffffffe40;
    for (local_8c = 0; local_8c < iVar3; local_8c = local_8c + 1) {
      in_stack_fffffffffffffe38 =
           (MoleculeStamp *)
           MoleculeStamp::getCutoffGroupStamp
                     ((MoleculeStamp *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10)
                      ,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      local_48 = in_stack_fffffffffffffe38;
      in_stack_fffffffffffffe30 =
           (vector<int,_std::allocator<int>_> *)
           CutoffGroupStamp::getNMembers((CutoffGroupStamp *)0x15f1f7);
      local_84 = local_84 + (int)in_stack_fffffffffffffe30;
    }
    local_3c = local_3c + iVar3 * local_34;
    local_38 = local_38 + local_84 * local_34;
    local_90 = 0;
    in_stack_fffffffffffffe28 = MoleculeStamp::getNRigidBodies((MoleculeStamp *)0x15f282);
    iVar3 = (int)in_stack_fffffffffffffe28;
    for (local_98 = 0; local_98 < iVar3; local_98 = local_98 + 1) {
      in_stack_fffffffffffffe20 =
           MoleculeStamp::getRigidBodyStamp
                     ((MoleculeStamp *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10)
                      ,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      local_50 = in_stack_fffffffffffffe20;
      sVar5 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x15f2e5);
      local_90 = local_90 + (int)sVar5;
    }
    *(int *)(in_RDI + 0xc) = iVar3 * local_34 + *(int *)(in_RDI + 0xc);
    local_54 = local_90 * local_34 + local_54;
    __gnu_cxx::
    __normal_iterator<OpenMD::Component_**,_std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>_>
    ::operator++(local_78);
  }
  *(int *)(in_RDI + 0xb) = (*(int *)((long)in_RDI + 0x54) - local_38) + local_3c;
  *(int *)((long)in_RDI + 0x5c) =
       (*(int *)((long)in_RDI + 0x54) - local_54) + *(int *)(in_RDI + 0xc);
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b));
  *(int *)(in_RDI + 10) = (int)sVar6;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  uVar2 = Globals::haveSeed((Globals *)0x15f3d6);
  if ((bool)uVar2) {
    in_stack_fffffffffffffe08 = (Globals *)Globals::getSeed((Globals *)0x15f3f7);
  }
  std::make_shared<OpenMD::Utils::RandNumGen,unsigned_long&>
            ((unsigned_long *)in_stack_fffffffffffffe38);
  std::shared_ptr<OpenMD::Utils::RandNumGen>::operator=
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)CONCAT17(uVar2,in_stack_fffffffffffffe10),
             (shared_ptr<OpenMD::Utils::RandNumGen> *)in_stack_fffffffffffffe08);
  std::shared_ptr<OpenMD::Utils::RandNumGen>::~shared_ptr
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)0x15f454);
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::~vector
            ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
             in_stack_fffffffffffffe20);
  return;
}

Assistant:

SimInfo::SimInfo(ForceField* ff, Globals* simParams) :
      forceField_(ff), simParams_(simParams), randNumGen_ {nullptr}, nAtoms_(0),
      nBonds_(0), nBends_(0), nTorsions_(0), nInversions_(0), nRigidBodies_(0),
      nIntegrableObjects_(0), nCutoffGroups_(0), nConstraints_(0),
      nFluctuatingCharges_(0), nGlobalMols_(0), nGlobalAtoms_(0),
      nGlobalCutoffGroups_(0), nGlobalIntegrableObjects_(0),
      nGlobalRigidBodies_(0), nGlobalFluctuatingCharges_(0), nGlobalBonds_(0),
      nGlobalBends_(0), nGlobalTorsions_(0), nGlobalInversions_(0),
      nGlobalConstraints_(0), hasNGlobalConstraints_(false), ndf_(0),
      fdf_local(0), ndfRaw_(0), ndfTrans_(0), nZconstraint_(0), sman_(NULL),
      topologyDone_(false), calcBoxDipole_(false), calcBoxQuadrupole_(false),
      useAtomicVirial_(true) {
    MoleculeStamp* molStamp;
    int nMolWithSameStamp;
    int nCutoffAtoms = 0;  // number of atoms belong to cutoff groups
    int nGroups      = 0;  // total cutoff groups defined in meta-data file
    CutoffGroupStamp* cgStamp;
    RigidBodyStamp* rbStamp;
    int nRigidAtoms = 0;

    vector<Component*> components = simParams->getComponents();

    for (vector<Component*>::iterator i = components.begin();
         i != components.end(); ++i) {
      molStamp = (*i)->getMoleculeStamp();
      if ((*i)->haveRegion()) {
        molStamp->setRegion((*i)->getRegion());
      } else {
        // set the region to a disallowed value:
        molStamp->setRegion(-1);
      }

      nMolWithSameStamp = (*i)->getNMol();

      addMoleculeStamp(molStamp, nMolWithSameStamp);

      // calculate atoms in molecules
      nGlobalAtoms_ += molStamp->getNAtoms() * nMolWithSameStamp;
      nGlobalBonds_ += molStamp->getNBonds() * nMolWithSameStamp;
      nGlobalBends_ += molStamp->getNBends() * nMolWithSameStamp;
      nGlobalTorsions_ += molStamp->getNTorsions() * nMolWithSameStamp;
      nGlobalInversions_ += molStamp->getNInversions() * nMolWithSameStamp;

      // calculate atoms in cutoff groups
      int nAtomsInGroups       = 0;
      int nCutoffGroupsInStamp = molStamp->getNCutoffGroups();

      for (int j = 0; j < nCutoffGroupsInStamp; j++) {
        cgStamp = molStamp->getCutoffGroupStamp(j);
        nAtomsInGroups += cgStamp->getNMembers();
      }

      nGroups += nCutoffGroupsInStamp * nMolWithSameStamp;

      nCutoffAtoms += nAtomsInGroups * nMolWithSameStamp;

      // calculate atoms in rigid bodies
      int nAtomsInRigidBodies = 0;
      int nRigidBodiesInStamp = molStamp->getNRigidBodies();

      for (int j = 0; j < nRigidBodiesInStamp; j++) {
        rbStamp = molStamp->getRigidBodyStamp(j);
        nAtomsInRigidBodies += rbStamp->getNMembers();
      }

      nGlobalRigidBodies_ += nRigidBodiesInStamp * nMolWithSameStamp;
      nRigidAtoms += nAtomsInRigidBodies * nMolWithSameStamp;
    }

    // every free atom (atom does not belong to cutoff groups) is a cutoff
    // group therefore the total number of cutoff groups in the system is
    // equal to the total number of atoms minus number of atoms belong to
    // cutoff group defined in meta-data file plus the number of cutoff
    // groups defined in meta-data file

    nGlobalCutoffGroups_ = nGlobalAtoms_ - nCutoffAtoms + nGroups;

    // every free atom (atom does not belong to rigid bodies) is an
    // integrable object therefore the total number of integrable objects
    // in the system is equal to the total number of atoms minus number of
    // atoms belong to rigid body defined in meta-data file plus the number
    // of rigid bodies defined in meta-data file
    nGlobalIntegrableObjects_ =
        nGlobalAtoms_ - nRigidAtoms + nGlobalRigidBodies_;

    nGlobalMols_ = molStampIds_.size();
    molToProcMap_.resize(nGlobalMols_);

    // Initialize the random number generator on each processing
    // element using either the user-supplied seed or a default seed
    std::uint_fast32_t seed;

    if (simParams_->haveSeed())
      seed = static_cast<std::uint_fast32_t>(simParams_->getSeed());
    else
      seed = std::mt19937::default_seed;

    randNumGen_ = std::make_shared<Utils::RandNumGen>(seed);
  }